

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O2

ThreadPriority dd::TaskQueuePriorityToThreadPriority(Priority priority)

{
  if (priority < (LOW|HIGH)) {
    return *(ThreadPriority *)(&DAT_0012dbb0 + (ulong)priority * 4);
  }
  return kNormalPriority;
}

Assistant:

ThreadPriority TaskQueuePriorityToThreadPriority(TaskQueueFactory::Priority priority)
	{
		switch (priority) {
		case TaskQueueFactory::Priority::HIGH:
			return kRealtimePriority;
		case TaskQueueFactory::Priority::LOW:
			return kLowPriority;
		case TaskQueueFactory::Priority::NORMAL:
			return kNormalPriority;
		default:
			return kNormalPriority;
		}
	}